

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O2

void __thiscall
glcts::MultisampleTextureTexStorage3DZeroSampleTest::initInternals
          (MultisampleTextureTexStorage3DZeroSampleTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() failed to generate texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                  ,0x15a);
  if (this->to_id != 0) {
    (**(code **)(lVar3 + 0xb8))(0x9102);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindTexture() reported an error",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0x165);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Texture object has not been generated properly",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
             ,0x15f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MultisampleTextureTexStorage3DZeroSampleTest::initInternals()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate texture object id */
	gl.genTextures(1, &to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed to generate texture");

	/* Verify texture object has been generated properly */
	if (to_id == 0)
	{
		TCU_FAIL("Texture object has not been generated properly");
	}

	/* Bind texture to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() reported an error");
}